

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_2_suite::test_two(void)

{
  undefined8 local_68;
  value_type local_60 [2];
  undefined8 local_50;
  value_type local_48 [2];
  undefined1 local_38 [8];
  moment<double,_2> filter;
  
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38,1.0);
  local_48[0] = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_50 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x6a,"void mean_double_2_suite::test_two()",local_48,&local_50);
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38,3.0);
  local_60[0] = trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::mean
                          ((basic_moment<double,_2UL,_(trial::online::with)1> *)local_38);
  local_68 = 0x4000000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","2.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x6c,"void mean_double_2_suite::test_two()",local_60,&local_68);
  return;
}

Assistant:

void test_two()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    filter.push(3.0);
    TRIAL_TEST_EQ(filter.mean(), 2.0);
}